

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O3

bool dxil_spv::emit_sample_instruction(Op opcode,Impl *impl,CallInst *instruction)

{
  Instruction *pIVar1;
  uint index;
  CallInst *instruction_00;
  char cVar2;
  bool bVar3;
  ComponentType element_type;
  Id IVar4;
  Id IVar5;
  uint uVar6;
  ValueKind VVar7;
  Op OVar8;
  Id IVar9;
  Value *pVVar10;
  mapped_type *pmVar11;
  undefined7 extraout_var;
  mapped_type *pmVar13;
  Builder *pBVar14;
  Operation *pOVar15;
  Operation *pOVar16;
  Operation *this;
  Operation *pOVar17;
  Type *pTVar18;
  byte bVar19;
  undefined4 uVar20;
  uint32_t *num_dimensions;
  char cVar21;
  undefined4 uVar22;
  undefined8 unaff_RBX;
  uint uVar23;
  undefined4 in_register_0000003c;
  uint uVar24;
  uint32_t uVar25;
  ulong uVar26;
  Op op;
  ulong uVar27;
  uint32_t image_ops;
  ComponentType tmp;
  uint num_coords;
  uint num_coords_full;
  Id image_id;
  Id coord [4];
  Id loaded_id;
  Id offsets [3];
  undefined1 in_stack_fffffffffffffed8;
  Id local_120;
  uint32_t local_11c;
  Id local_118;
  undefined4 local_114;
  ulong local_110;
  Id local_104;
  mapped_type *local_100;
  Op local_f4;
  Operation *local_f0;
  ComponentType local_e1;
  Builder *local_e0;
  uint local_d4;
  Operation *local_d0;
  Id local_c8;
  Id local_c4;
  uint local_c0;
  Id local_bc;
  Id local_b8;
  uint32_t local_b4;
  uint32_t local_b0;
  Id local_ac;
  Vector<spv::Id> local_a8;
  undefined1 local_88 [16];
  Builder *local_78;
  ulong local_70;
  CallInst *local_68;
  Id local_5c;
  Id local_58 [4];
  Id local_48;
  Id IStack_44;
  Id IStack_40;
  Id IStack_3c;
  ulong uVar12;
  
  local_110 = CONCAT44(in_register_0000003c,opcode);
  if (((opcode - SampleCmp < 2) || (opcode == SampleCmpBias)) || (opcode == SampleCmpLevel)) {
    cVar21 = (impl->execution_mode_meta).synthesize_dummy_derivatives;
    uVar22 = (undefined4)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  }
  else {
    cVar21 = (impl->execution_mode_meta).synthesize_dummy_derivatives;
    bVar3 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction);
    if (!bVar3) {
      return true;
    }
    uVar22 = 0;
  }
  local_e0 = Converter::Impl::builder(impl);
  pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  IVar4 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
  local_ac = IVar4;
  local_68 = instruction;
  pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  IVar5 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
  local_114 = uVar22;
  IVar4 = Converter::Impl::build_sampled_image(impl,IVar4,IVar5,SUB41(uVar22,0));
  pmVar11 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&impl->handle_to_resource_meta,&local_ac);
  local_b0 = 0;
  num_dimensions = &local_b4;
  local_b4 = 0;
  bVar3 = get_image_dimensions(impl,local_ac,&local_b0,num_dimensions);
  instruction_00 = local_68;
  uVar12 = CONCAT71(extraout_var,bVar3);
  if (!bVar3) {
    return false;
  }
  local_88 = (undefined1  [16])0x0;
  uVar26 = (ulong)local_b0;
  uVar23 = (uint)local_110;
  local_100 = pmVar11;
  local_b8 = IVar4;
  if (uVar26 != 0) {
    uVar27 = 0;
    do {
      pVVar10 = LLVMBC::Instruction::getOperand(&instruction_00->super_Instruction,(int)uVar27 + 3);
      IVar4 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
      uVar12 = (ulong)IVar4;
      *(Id *)(local_88 + uVar27 * 4) = IVar4;
      uVar27 = uVar27 + 1;
    } while (uVar26 != uVar27);
  }
  local_11c = 0;
  cVar2 = cVar21;
  if (cVar21 == '\0') {
LAB_0016becd:
    cVar21 = cVar2;
    local_118 = (Id)CONCAT71((int7)(uVar12 >> 8),uVar23 == 0x3c);
    bVar3 = uVar23 == 0xff;
    if (((uVar23 - 0x3c < 5) &&
        (num_dimensions = (uint32_t *)0x0, (0x13U >> (uVar23 - 0x3c & 0x1f) & 1) != 0)) ||
       (uVar23 == 0xff)) {
      emit_expect_assume_quad_uniform(impl);
    }
    uVar20 = (undefined4)CONCAT71((int7)((ulong)num_dimensions >> 8),uVar23 == 0x3e);
    uVar6 = uVar23;
    if (0x40 < (int)uVar23) {
      if (uVar23 != 0x41) {
        if (uVar23 == 0xff) goto LAB_0016bfbd;
        if (uVar23 != 0xe0) goto LAB_0016bfd9;
      }
      goto LAB_0016bfcc;
    }
    if (uVar23 == 0x3d) {
LAB_0016bfbd:
      local_11c = 1;
    }
    else if (uVar23 == 0x3e) goto LAB_0016bfcc;
  }
  else {
    if ((uVar23 & 0xfffffffe) == 0x3c) {
      uVar6 = 0x3e;
      uVar22 = (int)CONCAT71((int7)((ulong)num_dimensions >> 8),1);
    }
    else {
      uVar12 = 0;
      uVar6 = 0x41;
      num_dimensions = (uint32_t *)0x0;
      uVar20 = 0;
      uVar22 = 0;
      if (uVar23 != 0x40) {
        local_118 = 0;
        bVar3 = false;
        uVar6 = 0x41;
        cVar2 = '\0';
        if (uVar23 != 0xff) goto LAB_0016becd;
        goto LAB_0016bfcc;
      }
    }
    uVar20 = uVar22;
    local_118 = 0;
    bVar3 = false;
LAB_0016bfcc:
    local_11c = 2;
    uVar23 = uVar6;
  }
LAB_0016bfd9:
  local_f0 = (Operation *)CONCAT44(local_f0._4_4_,uVar20);
  local_58[2] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_d4 = local_b4;
  local_70 = uVar26;
  get_texel_offsets(impl,instruction_00,&local_11c,7,local_b4,local_58,
                    (bool)in_stack_fffffffffffffed8);
  local_bc = 0;
  uVar6 = 10;
  if ((char)local_114 != '\0') {
    pVVar10 = LLVMBC::Instruction::getOperand(&instruction_00->super_Instruction,10);
    local_bc = Converter::Impl::get_id_for_value(impl,pVVar10,0);
    uVar6 = 0xb;
  }
  index = bVar3 + 0xb;
  if ((char)local_118 != '\0') {
    index = 10;
  }
  local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)instruction_00;
  pmVar13 = std::__detail::
            _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&impl->llvm_composite_meta,(key_type *)&local_a8);
  local_110 = CONCAT44(local_110._4_4_,pmVar13->access_mask);
  if ((pmVar13->access_mask & 0x10) != 0) {
    local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = 0x29;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&local_e0->capabilities,(Capability *)&local_a8);
  }
  local_118 = 0;
  uVar24 = uVar23 - 0x3c;
  if (((uVar24 < 5) && ((0x13U >> (uVar24 & 0x1f) & 1) != 0)) || (uVar23 == 0xff)) {
    pVVar10 = LLVMBC::Instruction::getOperand(&instruction_00->super_Instruction,index);
    pVVar10 = LLVMBC::Internal::resolve_proxy(pVVar10);
    VVar7 = LLVMBC::Value::get_value_kind(pVVar10);
    if (VVar7 != Undef) {
      pVVar10 = LLVMBC::Instruction::getOperand(&instruction_00->super_Instruction,index);
      local_118 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
      local_11c = local_11c | 0x80;
      local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x2a;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&local_e0->capabilities,(Capability *)&local_a8);
    }
  }
  if ((cVar21 == '\0') && (((uVar23 - 0x3d < 2 || (uVar23 == 0xff)) || (uVar23 == 0xe0)))) {
    pVVar10 = LLVMBC::Instruction::getOperand(&instruction_00->super_Instruction,uVar6);
    local_120 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
    IVar4 = local_ac;
    if (((byte)local_f0 & (impl->options).quirks.assume_broken_sub_8x8_cube_mips) != 1)
    goto LAB_0016c351;
    pBVar14 = Converter::Impl::builder(impl);
    IVar5 = Converter::Impl::get_type_id(impl,IVar4);
    uVar22 = local_114;
    pIVar1 = (pBVar14->module).idToInstruction.
             super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start[IVar5];
    if (pIVar1->opCode != OpTypeImage) {
      __assert_fail("isImageType(typeId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.h"
                    ,0xd2,"Dim spv::Builder::getTypeDimensionality(Id) const");
    }
    if (*(int *)(*(long *)&(pIVar1->operands).
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data + 4) == 3) {
      IVar5 = spv::Builder::makeIntegerType(pBVar14,0x20,true);
      pOVar15 = Converter::Impl::allocate(impl,OpImageQueryLevels,IVar5);
      Operation::add_id(pOVar15,IVar4);
      Converter::Impl::add(impl,pOVar15,false);
      IVar4 = spv::Builder::makeIntegerType(pBVar14,0x20,true);
      pOVar17 = Converter::Impl::allocate(impl,OpISub,IVar4);
      Operation::add_id(pOVar17,pOVar15->id);
      IVar4 = spv::Builder::makeIntegerType(pBVar14,0x20,false);
      IVar4 = spv::Builder::makeIntConstant(pBVar14,IVar4,4,false);
      Operation::add_id(pOVar17,IVar4);
      Converter::Impl::add(impl,pOVar17,false);
      IVar4 = spv::Builder::makeFloatType(pBVar14,0x20);
      pOVar15 = Converter::Impl::allocate(impl,OpConvertSToF,IVar4);
      Operation::add_id(pOVar15,pOVar17->id);
      Converter::Impl::add(impl,pOVar15,false);
      if (impl->glsl_std450_ext == 0) {
        IVar4 = spv::Builder::import(pBVar14,"GLSL.std.450");
        impl->glsl_std450_ext = IVar4;
      }
      IVar4 = spv::Builder::makeFloatType(pBVar14,0x20);
      pOVar17 = Converter::Impl::allocate(impl,OpExtInst,IVar4);
      Operation::add_id(pOVar17,impl->glsl_std450_ext);
      Operation::add_literal(pOVar17,0x25);
      Operation::add_id(pOVar17,pOVar15->id);
      Operation::add_id(pOVar17,local_120);
      Converter::Impl::add(impl,pOVar17,false);
      local_120 = pOVar17->id;
    }
LAB_0016c3da:
    uVar23 = (uint)local_110;
    op = OpImageSparseSampleExplicitLod;
    if (((uint)local_110 & 0x10) == 0) {
      op = OpImageSampleExplicitLod;
    }
  }
  else {
    local_120 = spv::Builder::makeFloatConstant(local_e0,0.0,false);
LAB_0016c351:
    bVar3 = false;
    uVar22 = local_114;
    switch(uVar24) {
    case 0:
    case 1:
      bVar3 = (local_110 & 0x10) == 0;
      OVar8 = OpImageSampleImplicitLod;
      op = OpImageSparseSampleImplicitLod;
      break;
    case 2:
      goto LAB_0016c3da;
    case 3:
      goto switchD_0016c36c_caseD_3;
    case 5:
switchD_0016c36c_caseD_5:
      bVar3 = (local_110 & 0x10) == 0;
      OVar8 = OpImageSampleDrefExplicitLod;
      op = OpImageSparseSampleDrefExplicitLod;
      break;
    default:
      if (uVar23 == 0xe0) goto switchD_0016c36c_caseD_5;
      if (uVar23 != 0xff) {
        return false;
      }
    case 4:
      bVar3 = (local_110 & 0x10) == 0;
      OVar8 = OpImageSampleDrefImplicitLod;
      op = OpImageSparseSampleDrefImplicitLod;
    }
    uVar23 = (uint)local_110;
    if (bVar3) {
      op = OVar8;
    }
  }
  element_type = Converter::Impl::get_effective_typed_resource_type(local_100->component_type);
  bVar19 = (byte)uVar22 ^ 1;
  local_c0 = (uint)bVar19 + (uint)bVar19 * 2 + 1;
  IVar4 = Converter::Impl::get_type_id(impl,element_type,1,local_c0,false);
  if ((uVar23 & 0x10) != 0) {
    IVar5 = spv::Builder::makeIntegerType(local_e0,0x20,false);
    local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (iterator)0x0;
    local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)allocate_in_thread(8);
    local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start + 2;
    *local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
     _M_impl.super__Vector_impl_data._M_start = IVar5;
    local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start[1] = IVar4;
    local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish =
         local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    IVar4 = Converter::Impl::get_struct_type(impl,&local_a8,0,"SparseTexel");
    if (local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      free_in_thread(local_a8.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
    uVar22 = local_114;
    uVar23 = (uint)local_110;
  }
  IVar5 = 0;
  if ((impl->execution_model == ExecutionModelFragment) ||
     (((impl->options).compute_shader_derivatives & 1U) != 0)) {
    IVar9 = 0;
  }
  else {
    if (op < OpImageSparseSampleImplicitLod) {
      if (op == OpImageSampleImplicitLod) {
        local_f4 = OpImageSampleExplicitLod;
      }
      else {
        IVar9 = 0;
        if (op != OpImageSampleDrefImplicitLod) goto LAB_0016c85e;
        local_f4 = OpImageSampleDrefExplicitLod;
      }
    }
    else if (op == OpImageSparseSampleDrefImplicitLod) {
      local_f4 = OpImageSparseSampleDrefExplicitLod;
    }
    else {
      IVar9 = 0;
      if (op != OpImageSparseSampleImplicitLod) goto LAB_0016c85e;
      local_f4 = OpImageSparseSampleExplicitLod;
    }
    local_104 = IVar4;
    pBVar14 = Converter::Impl::builder(impl);
    local_c8 = spv::Builder::makeFloatType(pBVar14,0x20);
    uVar23 = local_d4;
    IVar4 = spv::Builder::makeVectorType(pBVar14,local_c8,local_d4);
    IVar5 = spv::Builder::makeFloatType(pBVar14,0x20);
    IVar5 = Converter::Impl::build_vector(impl,IVar5,(Id *)local_88,uVar23);
    local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start._0_4_ = 0x44;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&pBVar14->capabilities,(Capability *)&local_a8);
    pOVar15 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadSwap,IVar4);
    IVar9 = spv::Builder::makeIntegerType(pBVar14,0x20,false);
    IVar9 = spv::Builder::makeIntConstant(pBVar14,IVar9,3,false);
    Operation::add_id(pOVar15,IVar9);
    local_f0 = pOVar15;
    Operation::add_id(pOVar15,IVar5);
    IVar9 = spv::Builder::makeIntegerType(pBVar14,0x20,false);
    IVar9 = spv::Builder::makeIntConstant(pBVar14,IVar9,0,false);
    Operation::add_id(pOVar15,IVar9);
    pOVar15 = Converter::Impl::allocate(impl,OpGroupNonUniformQuadSwap,IVar4);
    IVar9 = spv::Builder::makeIntegerType(pBVar14,0x20,false);
    IVar9 = spv::Builder::makeIntConstant(pBVar14,IVar9,3,false);
    Operation::add_id(pOVar15,IVar9);
    local_d0 = pOVar15;
    Operation::add_id(pOVar15,IVar5);
    IVar9 = spv::Builder::makeIntegerType(pBVar14,0x20,false);
    local_78 = pBVar14;
    IVar9 = spv::Builder::makeIntConstant(pBVar14,IVar9,1,false);
    Operation::add_id(pOVar15,IVar9);
    pOVar16 = Converter::Impl::allocate(impl,OpFSub,IVar4);
    local_c4 = IVar4;
    this = Converter::Impl::allocate(impl,OpFSub,IVar4);
    Operation::add_id(pOVar16,IVar5);
    pOVar15 = local_f0;
    Operation::add_id(pOVar16,local_f0->id);
    Operation::add_id(this,IVar5);
    pOVar17 = local_d0;
    Operation::add_id(this,local_d0->id);
    Converter::Impl::add(impl,pOVar15,false);
    Converter::Impl::add(impl,pOVar17,false);
    Converter::Impl::add(impl,pOVar16,false);
    Converter::Impl::add(impl,this,false);
    IVar9 = pOVar16->id;
    IVar5 = this->id;
    uVar25 = local_11c;
    if ((local_11c & 1) != 0) {
      local_f0 = (Operation *)CONCAT44(local_f0._4_4_,IVar9);
      local_d0 = (Operation *)CONCAT44(local_d0._4_4_,IVar5);
      uVar25 = local_11c & 0xfffffffe;
      local_11c = uVar25;
      if (impl->glsl_std450_ext == 0) {
        IVar4 = spv::Builder::import(local_78,"GLSL.std.450");
        impl->glsl_std450_ext = IVar4;
      }
      pOVar15 = Converter::Impl::allocate(impl,OpExtInst,local_c8);
      Operation::add_id(pOVar15,impl->glsl_std450_ext);
      Operation::add_literal(pOVar15,0x1d);
      Operation::add_id(pOVar15,local_120);
      Converter::Impl::add(impl,pOVar15,false);
      IVar4 = local_c4;
      pOVar17 = Converter::Impl::allocate(impl,OpVectorTimesScalar,local_c4);
      pOVar16 = Converter::Impl::allocate(impl,OpVectorTimesScalar,IVar4);
      Operation::add_id(pOVar17,(Id)local_f0);
      Operation::add_id(pOVar17,pOVar15->id);
      Operation::add_id(pOVar16,(Id)local_d0);
      Operation::add_id(pOVar16,pOVar15->id);
      Converter::Impl::add(impl,pOVar17,false);
      Converter::Impl::add(impl,pOVar16,false);
      IVar9 = pOVar17->id;
      IVar5 = pOVar16->id;
    }
    local_11c = uVar25 | 4;
    uVar22 = local_114;
    uVar23 = (uint)local_110;
    IVar4 = local_104;
    op = local_f4;
  }
LAB_0016c85e:
  local_f0 = (Operation *)CONCAT44(local_f0._4_4_,IVar9);
  pOVar15 = Converter::Impl::allocate(impl,op,(Value *)instruction_00,IVar4);
  if ((uVar23 & 0x10) == 0) {
    pTVar18 = LLVMBC::Value::getType((Value *)instruction_00);
    pTVar18 = LLVMBC::Type::getStructElementType(pTVar18,0);
    Converter::Impl::decorate_relaxed_precision(impl,pTVar18,pOVar15->id,true);
  }
  Operation::add_id(pOVar15,local_b8);
  IVar4 = spv::Builder::makeFloatType(local_e0,0x20);
  IVar4 = Converter::Impl::build_vector(impl,IVar4,(Id *)local_88,(uint)local_70);
  Operation::add_id(pOVar15,IVar4);
  if (local_bc != 0) {
    Operation::add_id(pOVar15,local_bc);
  }
  uVar25 = local_11c;
  Operation::add_literal(pOVar15,local_11c);
  if ((uVar25 & 3) != 0) {
    Operation::add_id(pOVar15,local_120);
  }
  if ((uVar25 & 4) != 0) {
    Operation::add_id(pOVar15,(Id)local_f0);
    Operation::add_id(pOVar15,IVar5);
  }
  if ((uVar25 & 0x18) != 0) {
    IVar4 = build_texel_offset_vector(impl,local_58,local_d4,uVar25,false);
    Operation::add_id(pOVar15,IVar4);
  }
  if ((char)uVar25 < '\0') {
    Operation::add_id(pOVar15,local_118);
  }
  Converter::Impl::add(impl,pOVar15,false);
  pTVar18 = LLVMBC::Value::getType((Value *)instruction_00);
  pTVar18 = LLVMBC::Type::getStructElementType(pTVar18,0);
  if ((local_110 & 0x10) == 0) {
    if ((char)uVar22 == '\0') {
      Converter::Impl::fixup_load_type_typed
                (impl,local_100->component_type,4,(Value *)instruction_00,pTVar18);
    }
    else {
      local_5c = pOVar15->id;
      local_e1 = local_100->component_type;
      Converter::Impl::fixup_load_type_typed(impl,&local_e1,1,&local_5c,pTVar18);
      IVar4 = Converter::Impl::get_type_id(impl,pTVar18,0);
      IVar4 = spv::Builder::makeVectorType(local_e0,IVar4,4);
      pOVar15 = Converter::Impl::allocate(impl,OpCompositeConstruct,IVar4);
      local_48 = local_5c;
      IStack_44 = local_5c;
      IStack_40 = local_5c;
      IStack_3c = local_5c;
      local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x4;
      local_a8.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = &local_48;
      Operation::add_ids(pOVar15,(initializer_list<unsigned_int> *)&local_a8);
      Converter::Impl::add(impl,pOVar15,false);
      Converter::Impl::rewrite_value(impl,(Value *)instruction_00,pOVar15->id);
    }
  }
  else {
    Converter::Impl::repack_sparse_feedback
              (impl,local_100->component_type,local_c0,(Value *)instruction_00,pTVar18,0);
  }
  build_exploded_composite_from_vector(impl,&instruction_00->super_Instruction,4);
  bVar3 = true;
switchD_0016c36c_caseD_3:
  return bVar3;
}

Assistant:

bool emit_sample_instruction(DXIL::Op opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	bool comparison_sampling = opcode == DXIL::Op::SampleCmp ||
	                           opcode == DXIL::Op::SampleCmpLevelZero ||
	                           opcode == DXIL::Op::SampleCmpLevel ||
	                           opcode == DXIL::Op::SampleCmpBias;

	bool force_explicit_lod = impl.execution_mode_meta.synthesize_dummy_derivatives;

	// Elide dead loads.
	if (!comparison_sampling && !impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();

	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id sampler_id = impl.get_id_for_value(instruction->getOperand(2));
	spv::Id combined_image_sampler_id = impl.build_sampled_image(image_id, sampler_id, comparison_sampling);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	unsigned num_coords_full = 0, num_coords = 0;
	if (!get_image_dimensions(impl, image_id, &num_coords_full, &num_coords))
		return false;

	spv::Id coord[4] = {};
	for (unsigned i = 0; i < num_coords_full; i++)
		coord[i] = impl.get_id_for_value(instruction->getOperand(i + 3));

	uint32_t image_ops = 0;

	if (force_explicit_lod)
	{
		if (opcode == DXIL::Op::Sample || opcode == DXIL::Op::SampleBias)
			opcode = DXIL::Op::SampleLevel;
		else if (opcode == DXIL::Op::SampleCmp || opcode == DXIL::Op::SampleCmpBias)
			opcode = DXIL::Op::SampleCmpLevelZero;
		else
			force_explicit_lod = false;
	}

	if (opcode == DXIL::Op::Sample || opcode == DXIL::Op::SampleBias ||
	    opcode == DXIL::Op::SampleCmpBias || opcode == DXIL::Op::SampleCmp)
	{
		emit_expect_assume_quad_uniform(impl);
	}

	if (opcode == DXIL::Op::SampleLevel || opcode == DXIL::Op::SampleCmpLevelZero || opcode == DXIL::Op::SampleCmpLevel)
		image_ops |= spv::ImageOperandsLodMask;
	else if (opcode == DXIL::Op::SampleBias || opcode == DXIL::Op::SampleCmpBias)
		image_ops |= spv::ImageOperandsBiasMask;

	spv::Id offsets[3] = {};
	if (!get_texel_offsets(impl, instruction, image_ops, 7, num_coords, offsets, false))
		return false;

	spv::Id dref_id = 0;

	if (comparison_sampling)
		dref_id = impl.get_id_for_value(instruction->getOperand(10));

	spv::Id bias_level_argument = 0;
	spv::Id min_lod_argument = 0;
	unsigned bias_level_argument_index = comparison_sampling ? 11 : 10;
	unsigned min_lod_argument_index = 11;

	if (opcode == DXIL::Op::Sample)
		min_lod_argument_index = 10;
	else if (opcode == DXIL::Op::SampleCmpBias)
		min_lod_argument_index = 12;

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	if (opcode == DXIL::Op::Sample || opcode == DXIL::Op::SampleCmp || opcode == DXIL::Op::SampleBias || opcode == DXIL::Op::SampleCmpBias)
	{
		if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(min_lod_argument_index)))
		{
			min_lod_argument = impl.get_id_for_value(instruction->getOperand(min_lod_argument_index));
			image_ops |= spv::ImageOperandsMinLodMask;
			builder.addCapability(spv::CapabilityMinLod);
		}
	}

	if (force_explicit_lod)
		bias_level_argument = builder.makeFloatConstant(0.0f);
	else if (opcode == DXIL::Op::SampleBias || opcode == DXIL::Op::SampleCmpBias || opcode == DXIL::Op::SampleLevel || opcode == DXIL::Op::SampleCmpLevel)
		bias_level_argument = impl.get_id_for_value(instruction->getOperand(bias_level_argument_index));
	else
		bias_level_argument = builder.makeFloatConstant(0.0f);

	if (!force_explicit_lod && impl.options.quirks.assume_broken_sub_8x8_cube_mips && opcode == DXIL::Op::SampleLevel)
		bias_level_argument = emit_workaround_clamp_cube_mips(impl, image_id, bias_level_argument);

	spv::Op spv_op;

	switch (opcode)
	{
	case DXIL::Op::SampleLevel:
		spv_op = sparse ? spv::OpImageSparseSampleExplicitLod : spv::OpImageSampleExplicitLod;
		break;

	case DXIL::Op::Sample:
	case DXIL::Op::SampleBias:
		spv_op = sparse ? spv::OpImageSparseSampleImplicitLod : spv::OpImageSampleImplicitLod;
		break;

	case DXIL::Op::SampleCmp:
	case DXIL::Op::SampleCmpBias:
		spv_op = sparse ? spv::OpImageSparseSampleDrefImplicitLod : spv::OpImageSampleDrefImplicitLod;
		break;

	case DXIL::Op::SampleCmpLevel:
	case DXIL::Op::SampleCmpLevelZero:
		spv_op = sparse ? spv::OpImageSparseSampleDrefExplicitLod : spv::OpImageSampleDrefExplicitLod;
		break;

	default:
		return false;
	}

	auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
	spv::Id texel_type = impl.get_type_id(effective_component_type, 1, comparison_sampling ? 1 : 4);
	spv::Id grad_x = 0, grad_y = 0;
	spv::Id sample_type;

	if (sparse)
		sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
	else
		sample_type = texel_type;

	bool grad_rewrite = impl.execution_model != spv::ExecutionModelFragment &&
	                    !impl.options.compute_shader_derivatives;

	if (grad_rewrite)
	{
		switch (spv_op)
		{
		case spv::OpImageSampleImplicitLod:
			spv_op = spv::OpImageSampleExplicitLod;
			break;

		case spv::OpImageSparseSampleImplicitLod:
			spv_op = spv::OpImageSparseSampleExplicitLod;
			break;

		case spv::OpImageSampleDrefImplicitLod:
			spv_op = spv::OpImageSampleDrefExplicitLod;
			break;

		case spv::OpImageSparseSampleDrefImplicitLod:
			spv_op = spv::OpImageSparseSampleDrefExplicitLod;
			break;

		default:
			grad_rewrite = false;
			break;
		}
	}

	if (grad_rewrite)
		build_gradient(impl, coord, num_coords, grad_x, grad_y, bias_level_argument, image_ops);

	// Comparison sampling only returns a scalar, so we'll need to splat out result.
	Operation *op = impl.allocate(spv_op, instruction, sample_type);

	if (!sparse)
		impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

	op->add_id(combined_image_sampler_id);
	op->add_id(impl.build_vector(builder.makeFloatType(32), coord, num_coords_full));

	if (dref_id)
		op->add_id(dref_id);

	op->add_literal(image_ops);

	if (image_ops & (spv::ImageOperandsBiasMask | spv::ImageOperandsLodMask))
		op->add_id(bias_level_argument);

	if (image_ops & spv::ImageOperandsGradMask)
	{
		op->add_id(grad_x);
		op->add_id(grad_y);
	}

	if (image_ops & (spv::ImageOperandsConstOffsetMask | spv::ImageOperandsOffsetMask))
	{
		spv::Id offset_vec = build_texel_offset_vector(impl, offsets, num_coords, image_ops, false);
		op->add_id(offset_vec);
	}

	if (image_ops & spv::ImageOperandsMinLodMask)
		op->add_id(min_lod_argument);

	impl.add(op);

	auto *target_type = instruction->getType()->getStructElementType(0);

	if (sparse)
	{
		// Repack return arguments from { i32, Tx4 } into { T, T, T, T, i32 } which DXIL expects.
		impl.repack_sparse_feedback(meta.component_type, comparison_sampling ? 1 : 4, instruction, target_type);
	}
	else if (comparison_sampling)
	{
		spv::Id loaded_id = op->id;
		auto tmp = meta.component_type;
		impl.fixup_load_type_typed(tmp, 1, loaded_id, target_type);
		Operation *splat_op =
			impl.allocate(spv::OpCompositeConstruct, builder.makeVectorType(impl.get_type_id(target_type), 4));
		splat_op->add_ids({ loaded_id, loaded_id, loaded_id, loaded_id });
		impl.add(splat_op);
		impl.rewrite_value(instruction, splat_op->id);
	}
	else
	{
		impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
	}

	build_exploded_composite_from_vector(impl, instruction, 4);

	return true;
}